

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::add_padding_extension(CBB *cbb,uint16_t ext,size_t len)

{
  int iVar1;
  CBB child;
  CBB local_40;
  
  iVar1 = CBB_add_u16(cbb,ext);
  if (((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed(cbb,&local_40), iVar1 != 0)) &&
     (iVar1 = CBB_add_zeros(&local_40,len), iVar1 != 0)) {
    iVar1 = CBB_flush(cbb);
    return iVar1 != 0;
  }
  ERR_put_error(0x10,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0xea5);
  return false;
}

Assistant:

static bool add_padding_extension(CBB *cbb, uint16_t ext, size_t len) {
  CBB child;
  if (!CBB_add_u16(cbb, ext) ||  //
      !CBB_add_u16_length_prefixed(cbb, &child) ||
      !CBB_add_zeros(&child, len)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  return CBB_flush(cbb);
}